

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O2

LinkedModel * __thiscall CoreML::Specification::Model::mutable_linkedmodel(Model *this)

{
  LinkedModel *this_00;
  
  if (this->_oneof_case_[0] == 0x22c) {
    this_00 = (LinkedModel *)(this->Type_).pipelineclassifier_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 0x22c;
    this_00 = (LinkedModel *)operator_new(0x20);
    LinkedModel::LinkedModel(this_00);
    (this->Type_).linkedmodel_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::LinkedModel* Model::mutable_linkedmodel() {
  if (!has_linkedmodel()) {
    clear_Type();
    set_has_linkedmodel();
    Type_.linkedmodel_ = new ::CoreML::Specification::LinkedModel;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.linkedModel)
  return Type_.linkedmodel_;
}